

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O2

int UpnpSendAdvertisement(UpnpDevice_Handle Hnd,int Exp)

{
  int iVar1;
  
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x784,"Inside UpnpSendAdvertisement \n");
  iVar1 = UpnpSendAdvertisementLowPower(Hnd,Exp,-1,-1,-1);
  return iVar1;
}

Assistant:

int UpnpSendAdvertisement(UpnpDevice_Handle Hnd, int Exp)
{
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpSendAdvertisement \n");
	return UpnpSendAdvertisementLowPower(Hnd, Exp, -1, -1, -1);
}